

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Tri::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Tri *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  const_iterator cVar2;
  MthdNotify *pMVar3;
  MthdVtxY32 *pMVar4;
  MthdVtxX32 *pMVar5;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *this_01;
  MthdSolidFormat *pMVar6;
  MthdMissing *pMVar7;
  MthdCtxRop *pMVar8;
  MthdCtxClip *pMVar9;
  MthdNop *this_02;
  result_type rVar10;
  MthdPatch *this_03;
  MthdDmaNotify *this_04;
  MthdCtxPattern *this_05;
  MthdCtxBeta *this_06;
  MthdOperation *this_07;
  MthdVtxXy *pMVar11;
  MthdSolidColor *pMVar12;
  MthdCtxSurf *this_08;
  MthdCtxSurf2D *this_09;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_00;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_01;
  allocator_type local_618;
  allocator local_617;
  allocator local_616;
  allocator local_615;
  allocator local_614;
  allocator local_613;
  allocator local_612;
  allocator local_611;
  allocator local_610;
  allocator local_60f;
  allocator local_60e;
  allocator local_60d;
  allocator local_60c;
  allocator local_60b;
  allocator local_60a;
  allocator local_609;
  allocator local_608;
  allocator local_607;
  allocator local_606;
  allocator local_605;
  allocator local_604;
  allocator local_603;
  allocator local_602;
  allocator local_601;
  allocator local_600;
  allocator local_5ff;
  allocator local_5fe;
  allocator local_5fd;
  allocator local_5fc;
  allocator local_5fb;
  allocator local_5fa;
  allocator local_5f9;
  MthdNotify *local_5f8;
  const_iterator local_5f0;
  MthdVtxXy *local_5e8;
  MthdVtxXy *local_5e0;
  MthdSolidColor *local_5d8;
  MthdVtxY32 *local_5d0;
  MthdVtxX32 *local_5c8;
  MthdVtxXy *local_5c0;
  MthdVtxY32 *local_5b8;
  MthdVtxX32 *local_5b0;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_5a8;
  MthdVtxY32 *local_5a0;
  MthdVtxX32 *local_598;
  MthdVtxY32 *local_590;
  MthdVtxX32 *local_588;
  MthdVtxXy *local_580;
  MthdVtxXy *local_578;
  MthdVtxXy *local_570;
  MthdSolidColor *local_568;
  MthdSolidFormat *local_560;
  MthdMissing *local_558;
  MthdCtxRop *local_550;
  MthdCtxClip *local_548;
  string local_540;
  MthdVtxXy *local_520;
  MthdOperation *local_518;
  MthdCtxBeta *local_510;
  MthdCtxPattern *local_508;
  MthdDmaNotify *local_500;
  MthdPatch *local_4f8;
  MthdNop *local_4f0;
  string local_4e8;
  string local_4c8;
  MthdDmaNotify *local_4a8;
  MthdCtxClip *local_4a0;
  MthdCtxPattern *local_498;
  MthdCtxRop *local_490;
  MthdCtxBeta *local_488;
  MthdMissing *local_480;
  MthdOperation *local_478;
  MthdSolidFormat *local_470;
  MthdSolidColor *local_468;
  MthdVtxXy *local_460;
  MthdVtxXy *local_458;
  MthdVtxXy *local_450;
  MthdVtxX32 *local_448;
  MthdVtxY32 *local_440;
  MthdVtxX32 *local_438;
  MthdVtxY32 *local_430;
  MthdVtxX32 *local_428;
  MthdVtxY32 *local_420;
  MthdVtxXy *local_418;
  MthdVtxX32 *local_410;
  MthdVtxY32 *local_408;
  MthdSolidColor *local_400;
  MthdVtxXy *local_3f8;
  MthdVtxXy *local_3f0;
  MthdVtxXy *local_3e8;
  MthdSolidColor *local_3e0;
  MthdVtxXy *local_3d8;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_02 = (MthdNop *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  local_4f0 = this_02;
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_540,"nop",&local_5f9);
  opt = &(this->super_Class).opt;
  MthdNop::SingleMthdTest
            (this_02,opt,(uint32_t)rVar10,&local_540,-1,(this->super_Class).cls,0x100,1,4);
  local_4c8._M_dataplus._M_p = (pointer)this_02;
  local_5f8 = (MthdNotify *)operator_new(0x25950);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_4e8,"notify",&local_5fa);
  pMVar3 = local_5f8;
  MthdNotify::SingleMthdTest
            (local_5f8,opt,(uint32_t)rVar10,&local_4e8,0,(this->super_Class).cls,0x104,1,4);
  local_4c8._M_string_length = (size_type)pMVar3;
  this_03 = (MthdPatch *)operator_new(0x25950);
  local_4f8 = this_03;
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3b0,"patch",&local_5fb);
  MthdPatch::SingleMthdTest
            (this_03,opt,(uint32_t)rVar10,&local_3b0,-1,(this->super_Class).cls,0x10c,1,4);
  local_4c8.field_2._M_allocated_capacity = (size_type)this_03;
  local_5f0._M_current = (SingleMthdTest **)operator_new(0x25950);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  local_5a8 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_3d0,"pm_trigger",&local_5fc);
  cVar2._M_current = local_5f0._M_current;
  MthdPmTrigger::SingleMthdTest
            ((MthdPmTrigger *)local_5f0._M_current,opt,(uint32_t)rVar10,&local_3d0,-1,
             (this->super_Class).cls,0x140,1,4);
  local_4c8.field_2._8_8_ = cVar2._M_current;
  this_04 = (MthdDmaNotify *)operator_new(0x25950);
  local_500 = this_04;
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_50,"dma_notify",&local_5fd);
  MthdDmaNotify::SingleMthdTest
            (this_04,opt,(uint32_t)rVar10,&local_50,1,(this->super_Class).cls,0x180,1,4);
  local_4a8 = this_04;
  local_548 = (MthdCtxClip *)operator_new(0x25950);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_70,"ctx_clip",&local_5fe);
  pMVar9 = local_548;
  MthdCtxClip::SingleMthdTest
            (local_548,opt,(uint32_t)rVar10,&local_70,2,(this->super_Class).cls,0x184,1,4);
  local_4a0 = pMVar9;
  this_05 = (MthdCtxPattern *)operator_new(0x25958);
  local_508 = this_05;
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_90,"ctx_pattern",&local_5ff);
  uVar1 = (this->super_Class).cls;
  MthdCtxPattern::MthdCtxPattern(this_05,opt,(uint32_t)rVar10,&local_90,3,uVar1,0x188,uVar1 != 0x1d)
  ;
  local_498 = this_05;
  local_550 = (MthdCtxRop *)operator_new(0x25950);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_b0,"ctx_rop",&local_600);
  pMVar8 = local_550;
  MthdCtxRop::SingleMthdTest
            (local_550,opt,(uint32_t)rVar10,&local_b0,4,(this->super_Class).cls,0x18c,1,4);
  local_490 = pMVar8;
  this_06 = (MthdCtxBeta *)operator_new(0x25950);
  local_510 = this_06;
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_d0,"ctx_beta",&local_601);
  MthdCtxBeta::SingleMthdTest
            (this_06,opt,(uint32_t)rVar10,&local_d0,5,(this->super_Class).cls,400,1,4);
  local_488 = this_06;
  local_558 = (MthdMissing *)operator_new(0x25950);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_f0,"missing",&local_602);
  pMVar7 = local_558;
  MthdMissing::SingleMthdTest
            (local_558,opt,(uint32_t)rVar10,&local_f0,-1,(this->super_Class).cls,0x200,1,4);
  local_480 = pMVar7;
  this_07 = (MthdOperation *)operator_new(0x25958);
  local_518 = this_07;
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_110,"operation",&local_603);
  uVar1 = (this->super_Class).cls;
  MthdOperation::MthdOperation(this_07,opt,(uint32_t)rVar10,&local_110,8,uVar1,0x2fc,uVar1 != 0x1d);
  local_478 = this_07;
  local_560 = (MthdSolidFormat *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_130,"format",&local_604);
  pMVar6 = local_560;
  uVar1 = (this->super_Class).cls;
  MthdSolidFormat::MthdSolidFormat
            (local_560,opt,(uint32_t)rVar10,&local_130,9,uVar1,0x300,uVar1 != 0x1d);
  local_470 = pMVar6;
  local_568 = (MthdSolidColor *)operator_new(0x25950);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_150,"color",&local_605);
  pMVar12 = local_568;
  MthdSolidColor::SingleMthdTest
            (local_568,opt,(uint32_t)rVar10,&local_150,10,(this->super_Class).cls,0x304,1,4);
  local_468 = pMVar12;
  local_570 = (MthdVtxXy *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_170,"triangle.0.xy",&local_606);
  pMVar11 = local_570;
  MthdVtxXy::MthdVtxXy
            (local_570,opt,(uint32_t)rVar10,&local_170,0xb,(this->super_Class).cls,0x310,1,4,1);
  local_460 = pMVar11;
  local_578 = (MthdVtxXy *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_190,"triangle.1.xy",&local_607);
  pMVar11 = local_578;
  MthdVtxXy::MthdVtxXy
            (local_578,opt,(uint32_t)rVar10,&local_190,0xc,(this->super_Class).cls,0x314,1,4,0);
  local_458 = pMVar11;
  local_580 = (MthdVtxXy *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1b0,"triangle.2.xy",&local_608);
  pMVar11 = local_580;
  MthdVtxXy::MthdVtxXy
            (local_580,opt,(uint32_t)rVar10,&local_1b0,0xd,(this->super_Class).cls,0x318,1,4,4);
  local_450 = pMVar11;
  local_588 = (MthdVtxX32 *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1d0,"triangle32.0.x",&local_609);
  pMVar5 = local_588;
  MthdVtxX32::MthdVtxX32
            (local_588,opt,(uint32_t)rVar10,&local_1d0,0xe,(this->super_Class).cls,800,1,4,1);
  local_448 = pMVar5;
  local_590 = (MthdVtxY32 *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1f0,"triangle32.0.y",&local_60a);
  pMVar4 = local_590;
  MthdVtxY32::MthdVtxY32
            (local_590,opt,(uint32_t)rVar10,&local_1f0,0xf,(this->super_Class).cls,0x324,1,4,1);
  local_440 = pMVar4;
  local_598 = (MthdVtxX32 *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_210,"triangle32.1.x",&local_60b);
  pMVar5 = local_598;
  MthdVtxX32::MthdVtxX32
            (local_598,opt,(uint32_t)rVar10,&local_210,0x10,(this->super_Class).cls,0x328,1,4,0);
  local_438 = pMVar5;
  local_5a0 = (MthdVtxY32 *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_230,"triangle32.1.y",&local_60c);
  pMVar4 = local_5a0;
  MthdVtxY32::MthdVtxY32
            (local_5a0,opt,(uint32_t)rVar10,&local_230,0x11,(this->super_Class).cls,0x32c,1,4,0);
  local_430 = pMVar4;
  local_5b0 = (MthdVtxX32 *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_250,"triangle32.2.x",&local_60d);
  pMVar5 = local_5b0;
  MthdVtxX32::MthdVtxX32
            (local_5b0,opt,(uint32_t)rVar10,&local_250,0x12,(this->super_Class).cls,0x330,1,4,4);
  local_428 = pMVar5;
  local_5b8 = (MthdVtxY32 *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_270,"triangle32.2.y",&local_60e);
  pMVar4 = local_5b8;
  MthdVtxY32::MthdVtxY32
            (local_5b8,opt,(uint32_t)rVar10,&local_270,0x13,(this->super_Class).cls,0x334,1,4,4);
  local_420 = pMVar4;
  local_5c0 = (MthdVtxXy *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_290,"polytri.xy",&local_60f);
  pMVar11 = local_5c0;
  MthdVtxXy::MthdVtxXy
            (local_5c0,opt,(uint32_t)rVar10,&local_290,0x14,(this->super_Class).cls,0x400,0x20,4,6);
  local_418 = pMVar11;
  local_5c8 = (MthdVtxX32 *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2b0,"polytri32.x",&local_610);
  pMVar5 = local_5c8;
  MthdVtxX32::MthdVtxX32
            (local_5c8,opt,(uint32_t)rVar10,&local_2b0,0x15,(this->super_Class).cls,0x480,0x10,8,6);
  local_410 = pMVar5;
  local_5d0 = (MthdVtxY32 *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2d0,"polytri32.y",&local_611);
  pMVar4 = local_5d0;
  MthdVtxY32::MthdVtxY32
            (local_5d0,opt,(uint32_t)rVar10,&local_2d0,0x16,(this->super_Class).cls,0x484,0x10,8,6);
  local_408 = pMVar4;
  local_5d8 = (MthdSolidColor *)operator_new(0x25950);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2f0,"ctriangle.color",&local_612);
  pMVar12 = local_5d8;
  MthdSolidColor::SingleMthdTest
            (local_5d8,opt,(uint32_t)rVar10,&local_2f0,0x17,(this->super_Class).cls,0x500,8,0x10);
  local_400 = pMVar12;
  local_5e0 = (MthdVtxXy *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_310,"ctriangle.0.xy",&local_613);
  pMVar11 = local_5e0;
  MthdVtxXy::MthdVtxXy
            (local_5e0,opt,(uint32_t)rVar10,&local_310,0x18,(this->super_Class).cls,0x504,8,0x10,1);
  local_3f8 = pMVar11;
  local_5e8 = (MthdVtxXy *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_330,"ctriangle.1.xy",&local_614);
  pMVar11 = local_5e8;
  MthdVtxXy::MthdVtxXy
            (local_5e8,opt,(uint32_t)rVar10,&local_330,0x19,(this->super_Class).cls,0x508,8,0x10,0);
  local_3f0 = pMVar11;
  pMVar11 = (MthdVtxXy *)operator_new(0x25958);
  local_520 = pMVar11;
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_350,"ctriangle.2.xy",&local_615);
  MthdVtxXy::MthdVtxXy
            (pMVar11,opt,(uint32_t)rVar10,&local_350,0x1a,(this->super_Class).cls,0x50c,8,0x10,4);
  local_3e8 = pMVar11;
  pMVar12 = (MthdSolidColor *)operator_new(0x25950);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_370,"cpolytri.color",&local_616);
  MthdSolidColor::SingleMthdTest
            (pMVar12,opt,(uint32_t)rVar10,&local_370,0x1b,(this->super_Class).cls,0x580,0x10,8);
  local_3e0 = pMVar12;
  pMVar11 = (MthdVtxXy *)operator_new(0x25958);
  rVar10 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_390,"cpolytri.xy",&local_617);
  MthdVtxXy::MthdVtxXy
            (pMVar11,opt,(uint32_t)rVar10,&local_390,0x1c,(this->super_Class).cls,0x584,0x10,8,6);
  this_01 = local_5a8;
  __l._M_len = 0x1f;
  __l._M_array = (iterator)&local_4c8;
  local_3d8 = pMVar11;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_5a8,__l,&local_618);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_540);
  cVar2._M_current =
       (this_01->
       super__Vector_base<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if ((this->super_Class).cls == 0x1d) {
    this_08 = (MthdCtxSurf *)operator_new(0x25958);
    rVar10 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_4c8,"ctx_dst",(allocator *)&local_4e8);
    MthdCtxSurf::MthdCtxSurf
              (this_08,opt,(uint32_t)rVar10,&local_4c8,7,(this->super_Class).cls,0x194,0);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_540;
    local_540._M_dataplus._M_p = (pointer)this_08;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(this_01,cVar2,__l_00);
  }
  else {
    local_5f8 = (MthdNotify *)operator_new(0x25950);
    rVar10 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    local_5f0._M_current = cVar2._M_current;
    std::__cxx11::string::string((string *)&local_4c8,"ctx_beta4",(allocator *)&local_3b0);
    pMVar3 = local_5f8;
    MthdCtxBeta4::SingleMthdTest
              ((MthdCtxBeta4 *)local_5f8,opt,(uint32_t)rVar10,&local_4c8,6,(this->super_Class).cls,
               0x194,1,4);
    local_4e8._M_dataplus._M_p = (pointer)pMVar3;
    this_09 = (MthdCtxSurf2D *)operator_new(0x25958);
    rVar10 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(this_00);
    std::__cxx11::string::string((string *)&local_540,"ctx_surf2d",(allocator *)&local_3d0);
    cVar2._M_current = local_5f0._M_current;
    MthdCtxSurf2D::MthdCtxSurf2D
              (this_09,opt,(uint32_t)rVar10,&local_540,7,(this->super_Class).cls,0x198,1);
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)&local_4e8;
    local_4e8._M_string_length = (size_type)this_09;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(this_01,cVar2,__l_01);
    std::__cxx11::string::~string((string *)&local_540);
  }
  std::__cxx11::string::~string((string *)&local_4c8);
  return this_01;
}

Assistant:

std::vector<SingleMthdTest *> Tri::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdCtxClip(opt, rnd(), "ctx_clip", 2, cls, 0x184),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x188, cls != 0x1d),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x18c),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x190),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 8, cls, 0x2fc, cls != 0x1d),
		new MthdSolidFormat(opt, rnd(), "format", 9, cls, 0x300, cls != 0x1d),
		new MthdSolidColor(opt, rnd(), "color", 10, cls, 0x304),
		new MthdVtxXy(opt, rnd(), "triangle.0.xy", 11, cls, 0x310, 1, 4, VTX_FIRST),
		new MthdVtxXy(opt, rnd(), "triangle.1.xy", 12, cls, 0x314, 1, 4, 0),
		new MthdVtxXy(opt, rnd(), "triangle.2.xy", 13, cls, 0x318, 1, 4, VTX_DRAW),
		new MthdVtxX32(opt, rnd(), "triangle32.0.x", 14, cls, 0x320, 1, 4, VTX_FIRST),
		new MthdVtxY32(opt, rnd(), "triangle32.0.y", 15, cls, 0x324, 1, 4, VTX_FIRST),
		new MthdVtxX32(opt, rnd(), "triangle32.1.x", 16, cls, 0x328, 1, 4, 0),
		new MthdVtxY32(opt, rnd(), "triangle32.1.y", 17, cls, 0x32c, 1, 4, 0),
		new MthdVtxX32(opt, rnd(), "triangle32.2.x", 18, cls, 0x330, 1, 4, VTX_DRAW),
		new MthdVtxY32(opt, rnd(), "triangle32.2.y", 19, cls, 0x334, 1, 4, VTX_DRAW),
		new MthdVtxXy(opt, rnd(), "polytri.xy", 20, cls, 0x400, 0x20, 4, VTX_POLY | VTX_DRAW),
		new MthdVtxX32(opt, rnd(), "polytri32.x", 21, cls, 0x480, 0x10, 8, VTX_POLY | VTX_DRAW),
		new MthdVtxY32(opt, rnd(), "polytri32.y", 22, cls, 0x484, 0x10, 8, VTX_POLY | VTX_DRAW),
		new MthdSolidColor(opt, rnd(), "ctriangle.color", 23, cls, 0x500, 8, 0x10),
		new MthdVtxXy(opt, rnd(), "ctriangle.0.xy", 24, cls, 0x504, 8, 0x10, VTX_FIRST),
		new MthdVtxXy(opt, rnd(), "ctriangle.1.xy", 25, cls, 0x508, 8, 0x10, 0),
		new MthdVtxXy(opt, rnd(), "ctriangle.2.xy", 26, cls, 0x50c, 8, 0x10, VTX_DRAW),
		new MthdSolidColor(opt, rnd(), "cpolytri.color", 27, cls, 0x580, 0x10, 8),
		new MthdVtxXy(opt, rnd(), "cpolytri.xy", 28, cls, 0x584, 0x10, 8, VTX_POLY | VTX_DRAW),
	};
	if (cls == 0x1d) {
		res.insert(res.end(), {
			new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x194, 0),
		});
	} else {
		res.insert(res.end(), {
			new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 6, cls, 0x194),
			new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 7, cls, 0x198, SURF2D_NV10),
		});
	}
	return res;
}